

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOCC-CTA-cs16btech11038.cpp
# Opt level: O0

ssize_t __thiscall BOCC_CTA::read(BOCC_CTA *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  char cVar2;
  reference ppDVar3;
  mapped_type *ppTVar4;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  DataItem *curItem;
  Transaction *cur;
  int *store_local;
  int dIdx_local;
  int tid_local;
  BOCC_CTA *this_local;
  
  store_local._0_4_ = (int)__buf;
  cur = (Transaction *)__nbytes;
  store_local._4_4_ = __fd;
  _dIdx_local = this;
  std::shared_mutex::lock_shared(&this->scheduler_lock);
  ppDVar3 = std::vector<DataItem_*,_std::allocator<DataItem_*>_>::operator[]
                      (&this->dataItems,(long)(int)store_local);
  std::mutex::lock(&(*ppDVar3)->lock);
  ppTVar4 = std::
            unordered_map<int,_Transaction_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
            ::operator[](&this->transactions,(key_type *)((long)&store_local + 4));
  curItem = (DataItem *)*ppTVar4;
  std::mutex::lock(&((mapped_type)curItem)->t_status_mtx);
  cVar2 = Transaction::getStatus((Transaction *)curItem);
  if (cVar2 == 'a') {
    ppDVar3 = std::vector<DataItem_*,_std::allocator<DataItem_*>_>::operator[]
                        (&this->dataItems,(long)(int)store_local);
    std::set<Transaction_*,_TransCompare,_std::allocator<Transaction_*>_>::erase
              (&(*ppDVar3)->read_list,(key_type *)&curItem);
    std::mutex::unlock((mutex *)&(curItem->read_list)._M_t._M_impl.super__Rb_tree_header);
    ppDVar3 = std::vector<DataItem_*,_std::allocator<DataItem_*>_>::operator[]
                        (&this->dataItems,(long)(int)store_local);
    std::mutex::unlock(&(*ppDVar3)->lock);
    std::shared_mutex::unlock_shared(&this->scheduler_lock);
    this_local._4_4_ = 0xfffffffe;
  }
  else {
    ppDVar3 = std::vector<DataItem_*,_std::allocator<DataItem_*>_>::operator[]
                        (&this->dataItems,(long)(int)store_local);
    uVar1 = (*ppDVar3)->value;
    *(uint *)cur = uVar1;
    Transaction::read((Transaction *)curItem,(int)store_local,
                      (void *)CONCAT44(extraout_var,extraout_EDX),(ulong)uVar1);
    std::mutex::unlock((mutex *)&(curItem->read_list)._M_t._M_impl.super__Rb_tree_header);
    ppDVar3 = std::vector<DataItem_*,_std::allocator<DataItem_*>_>::operator[]
                        (&this->dataItems,(long)(int)store_local);
    std::mutex::unlock(&(*ppDVar3)->lock);
    std::shared_mutex::unlock_shared(&this->scheduler_lock);
    this_local._4_4_ = 0;
  }
  return (ulong)this_local._4_4_;
}

Assistant:

int BOCC_CTA::read(int tid, int dIdx, int *store) {
    scheduler_lock.lock_shared();
    dataItems[dIdx]->lock.lock();

    Transaction *cur = transactions[tid];
    cur->t_status_mtx.lock();

    if(cur->getStatus()=='a'){

        // remove this transaction from the read list of this data item.
        dataItems[dIdx]->read_list.erase(cur);

        cur->t_status_mtx.unlock();
        dataItems[dIdx]->lock.unlock();
        scheduler_lock.unlock_shared();

        return -2;
    }

    DataItem* curItem = dataItems[dIdx];
    //curItem->read_list.insert(cur);
    *store = curItem->value;
    // This function just adds dIdx to the readSet!
    cur->read(dIdx);

    cur->t_status_mtx.unlock();
    dataItems[dIdx]->lock.unlock();
    scheduler_lock.unlock_shared();

    return 0;
}